

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

vector<Post,_std::allocator<Post>_> * __thiscall
Database::getLikedPostsForUser
          (vector<Post,_std::allocator<Post>_> *__return_storage_ptr__,Database *this,int userId)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  DatabaseException *this_00;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [8];
  string error;
  int retval;
  __cxx11 local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [8];
  string query;
  char *local_28;
  char *errorMsg;
  Database *pDStack_18;
  int userId_local;
  Database *this_local;
  vector<Post,_std::allocator<Post>_> *result;
  
  local_28 = (char *)0x0;
  errorMsg._4_4_ = userId;
  pDStack_18 = this;
  this_local = (Database *)__return_storage_ptr__;
  std::vector<Post,_std::allocator<Post>_>::vector(__return_storage_ptr__);
  std::__cxx11::to_string(local_90,errorMsg._4_4_);
  std::operator+((char *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "select * from posts inner join likes on likes.post_id = posts.id where likes.user_id = "
                );
  std::operator+(local_50,(char *)local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_90);
  db = this->database;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = sqlite3_exec(db,pcVar2,add_post_callback,__return_storage_ptr__,&local_28);
  pcVar2 = local_28;
  if (iVar1 == 0) {
    std::__cxx11::string::~string((string *)local_50);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,pcVar2,&local_c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  sqlite3_free(local_28);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+((char *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Error while getting liked posts for user: ");
  DatabaseException::DatabaseException(this_00,local_e8);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

std::vector<Post> Database::getLikedPostsForUser(int userId)
{
	char* errorMsg = nullptr;
	std::vector<Post> result;
	std::string query = "select * from posts inner join likes on likes.post_id = posts.id "
			"where likes.user_id = " + std::to_string(userId) + ";";

	int retval = sqlite3_exec(database, query.c_str(), add_post_callback, &result, &errorMsg);

	if(retval != SQLITE_OK)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting liked posts for user: " + error);
	}
	else
	{
		return result;
	}
}